

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_property.cpp
# Opt level: O2

Value anon_unknown.dwarf_92a6e::string_to_value(string *val)

{
  bool bVar1;
  int iVar2;
  Value VVar3;
  Value VVar4;
  int idx;
  long lVar5;
  size_type sVar6;
  undefined **ppuVar7;
  string lower;
  
  std::__cxx11::string::string((string *)&lower,(string *)val);
  for (sVar6 = 0; lower._M_string_length != sVar6; sVar6 = sVar6 + 1) {
    iVar2 = tolower((int)lower._M_dataplus._M_p[sVar6]);
    lower._M_dataplus._M_p[sVar6] = (char)iVar2;
  }
  ppuVar7 = &(anonymous_namespace)::VALUE_STRINGS;
  lVar5 = 0;
  VVar4 = 4;
  do {
    if (lVar5 == 4) {
LAB_0010ec57:
      VVar3 = VALUE_ERROR;
      if (VVar4 < VALUE_ERROR) {
        VVar3 = VVar4;
      }
      std::__cxx11::string::~string((string *)&lower);
      return VVar3;
    }
    bVar1 = std::operator==(&lower,*ppuVar7);
    if (bVar1) {
      VVar4 = (Value)lVar5;
      goto LAB_0010ec57;
    }
    lVar5 = lVar5 + 1;
    ppuVar7 = ppuVar7 + 1;
  } while( true );
}

Assistant:

inline lsim::Value string_to_value(const std::string &val) {
    // tolower should be ok for our use-case. Including ICU in the project for this seems overly complicated.
    auto lower = val;
    std::transform(lower.begin(), lower.end(), lower.begin(), ::tolower);

    for (int idx = 0; idx < 4; ++idx) {
        if (lower == VALUE_STRINGS[idx]) {
            return static_cast<lsim::Value>(idx);
        }
    }

    return lsim::VALUE_ERROR;
}